

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void whereLoopOutputAdjust(WhereClause *pWC,WhereLoop *pLoop,LogEst nRow)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  short sVar5;
  int iVar6;
  Parse *pParse;
  short in_DX;
  ulong *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  Expr *pRight;
  LogEst iReduce;
  int j;
  int i;
  Bitmask notAllowed;
  WhereTerm *pX;
  WhereTerm *pTerm;
  int k;
  undefined6 in_stack_ffffffffffffffb0;
  short sVar7;
  uint local_48;
  int local_44;
  Expr *pValue;
  Expr *p;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pValue = (Expr *)&DAT_aaaaaaaaaaaaaaaa;
  pParse = (Parse *)((*in_RSI | in_RSI[1]) ^ 0xffffffffffffffff);
  sVar7 = 0;
  local_44 = *(int *)((long)in_RDI + 0x1c);
  p = (Expr *)in_RDI[4];
  do {
    if (local_44 < 1) {
      if ((int)in_DX - (int)sVar7 < (int)*(short *)((long)in_RSI + 0x16)) {
        *(short *)((long)in_RSI + 0x16) = in_DX - sVar7;
      }
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
        __stack_chk_fail();
      }
      return;
    }
    uVar2._0_2_ = p->iColumn;
    uVar2._2_2_ = p->iAgg;
    uVar2._4_4_ = p->w;
    if ((((uVar2 & (ulong)pParse) == 0) &&
        (uVar3._0_2_ = p->iColumn, uVar3._2_2_ = p->iAgg, uVar3._4_4_ = p->w,
        (uVar3 & in_RSI[1]) != 0)) && (((ulong)p->pLeft & 0x20000) == 0)) {
      local_48 = (uint)*(ushort *)((long)in_RSI + 0x34);
      while (local_48 = local_48 - 1, -1 < (int)local_48) {
        pValue = *(Expr **)(in_RSI[8] + (long)(int)local_48 * 8);
        if ((pValue != (Expr *)0x0) &&
           ((pValue == p ||
            ((-1 < *(int *)&pValue->pRight &&
             ((Expr *)(in_RDI[4] + (long)*(int *)&pValue->pRight * 0x38) == p)))))) break;
      }
      if ((int)local_48 < 0) {
        sqlite3ProgressCheck((Parse *)CONCAT26(sVar7,in_stack_ffffffffffffffb0));
        uVar4._0_2_ = p->iColumn;
        uVar4._2_2_ = p->iAgg;
        uVar4._4_4_ = p->w;
        if ((in_RSI[1] == uVar4) &&
           ((((ulong)p->pLeft & 0x3f00000000) != 0 ||
            ((*(byte *)(*(long *)(*in_RDI + 8) + (ulong)(byte)in_RSI[2] * 0x48 + 0x20) & 0x48) == 0)
            ))) {
          *(uint *)(in_RSI + 6) = (uint)in_RSI[6] | 0x800000;
        }
        if (*(short *)&p->pLeft < 1) {
          *(short *)((long)in_RSI + 0x16) = *(short *)((long)in_RSI + 0x16) + *(short *)&p->pLeft;
        }
        else {
          *(short *)((long)in_RSI + 0x16) = *(short *)((long)in_RSI + 0x16) + -1;
          if (((ulong)p->pLeft & 0x8200000000) != 0) {
            iVar6 = sqlite3ExprIsInteger(p,(int *)pValue,pParse);
            if (iVar6 == 0) {
              sVar5 = 0x14;
            }
            else {
              sVar5 = 10;
            }
            if (sVar7 < sVar5) {
              *(ushort *)((long)&p->pLeft + 2) = *(ushort *)((long)&p->pLeft + 2) | 0x2000;
              sVar7 = sVar5;
            }
          }
        }
      }
    }
    local_44 = local_44 + -1;
    p = (Expr *)&p->pAggInfo;
  } while( true );
}

Assistant:

static void whereLoopOutputAdjust(
  WhereClause *pWC,      /* The WHERE clause */
  WhereLoop *pLoop,      /* The loop to adjust downward */
  LogEst nRow            /* Number of rows in the entire table */
){
  WhereTerm *pTerm, *pX;
  Bitmask notAllowed = ~(pLoop->prereq|pLoop->maskSelf);
  int i, j;
  LogEst iReduce = 0;    /* pLoop->nOut should not exceed nRow-iReduce */

  assert( (pLoop->wsFlags & WHERE_AUTO_INDEX)==0 );
  for(i=pWC->nBase, pTerm=pWC->a; i>0; i--, pTerm++){
    assert( pTerm!=0 );
    if( (pTerm->prereqAll & notAllowed)!=0 ) continue;
    if( (pTerm->prereqAll & pLoop->maskSelf)==0 ) continue;
    if( (pTerm->wtFlags & TERM_VIRTUAL)!=0 ) continue;
    for(j=pLoop->nLTerm-1; j>=0; j--){
      pX = pLoop->aLTerm[j];
      if( pX==0 ) continue;
      if( pX==pTerm ) break;
      if( pX->iParent>=0 && (&pWC->a[pX->iParent])==pTerm ) break;
    }
    if( j<0 ){
      sqlite3ProgressCheck(pWC->pWInfo->pParse);
      if( pLoop->maskSelf==pTerm->prereqAll ){
        /* If there are extra terms in the WHERE clause not used by an index
        ** that depend only on the table being scanned, and that will tend to
        ** cause many rows to be omitted, then mark that table as
        ** "self-culling".
        **
        ** 2022-03-24:  Self-culling only applies if either the extra terms
        ** are straight comparison operators that are non-true with NULL
        ** operand, or if the loop is not an OUTER JOIN.
        */
        if( (pTerm->eOperator & 0x3f)!=0
         || (pWC->pWInfo->pTabList->a[pLoop->iTab].fg.jointype
                  & (JT_LEFT|JT_LTORJ))==0
        ){
          pLoop->wsFlags |= WHERE_SELFCULL;
        }
      }
      if( pTerm->truthProb<=0 ){
        /* If a truth probability is specified using the likelihood() hints,
        ** then use the probability provided by the application. */
        pLoop->nOut += pTerm->truthProb;
      }else{
        /* In the absence of explicit truth probabilities, use heuristics to
        ** guess a reasonable truth probability. */
        pLoop->nOut--;
        if( (pTerm->eOperator&(WO_EQ|WO_IS))!=0
         && (pTerm->wtFlags & TERM_HIGHTRUTH)==0  /* tag-20200224-1 */
        ){
          Expr *pRight = pTerm->pExpr->pRight;
          int k = 0;
          testcase( pTerm->pExpr->op==TK_IS );
          if( sqlite3ExprIsInteger(pRight, &k, 0) && k>=(-1) && k<=1 ){
            k = 10;
          }else{
            k = 20;
          }
          if( iReduce<k ){
            pTerm->wtFlags |= TERM_HEURTRUTH;
            iReduce = k;
          }
        }
      }
    }
  }
  if( pLoop->nOut > nRow-iReduce ){
    pLoop->nOut = nRow - iReduce;
  }
}